

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * CreateConditionCast(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  uint uVar1;
  TypeStruct *type;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  ExprError *pEVar7;
  undefined4 extraout_var_00;
  InplaceStr name;
  
  type = (TypeStruct *)value->type;
  if ((type == (TypeStruct *)0x0) || ((type->super_TypeBase).typeID != 0)) {
    bVar4 = ExpressionContext::IsIntegerType(ctx,(TypeBase *)type);
    if ((bVar4) || ((type->super_TypeBase).isGeneric != false)) {
      AssertValueExpression(ctx,source,value);
      pEVar6 = value;
      if (value->type == ctx->typeLong) goto LAB_001c3de2;
    }
    else {
      if (((((TypeStruct *)ctx->typeFloat == type) || ((TypeStruct *)ctx->typeDouble == type)) ||
          (uVar1 = (type->super_TypeBase).typeID, uVar1 == 0x15)) ||
         ((uVar1 == 0x14 || (uVar1 == 0x12)))) {
LAB_001c3de2:
        pEVar6 = CreateCast(ctx,source,value,ctx->typeBool,false);
        return pEVar6;
      }
      if (type == ctx->typeAutoRef) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
        pSVar2 = value->source;
        pTVar3 = ctx->typeNullPtr;
        pEVar6->typeID = 9;
        pEVar6->source = pSVar2;
        pEVar6->type = pTVar3;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e35c8;
        pEVar6 = CreateBinaryOp(ctx,source,SYN_BINARY_OP_NOT_EQUAL,value,pEVar6);
        return pEVar6;
      }
      name.end = "";
      name.begin = "bool";
      pEVar6 = CreateFunctionCall1(ctx,source,name,value,true,false,false);
      if (pEVar6 == (ExprBase *)0x0) {
        pEVar7 = anon_unknown.dwarf_ff84f::ReportExpected
                           (ctx,source,ctx->typeBool,
                            "ERROR: condition type cannot be \'%.*s\' and function for conversion to bool is undefined"
                            ,(ulong)(uint)(*(int *)&(value->type->name).end -
                                          (int)(value->type->name).begin));
        return &pEVar7->super_ExprBase;
      }
    }
  }
  else {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pTVar3 = ctx->typeBool;
    pEVar6->typeID = 0x12;
    pEVar6->source = source;
    pEVar6->type = pTVar3;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
    pEVar6[1]._vptr_ExprBase = (_func_int **)value;
    pEVar6[1].typeID = 0xd;
  }
  return pEVar6;
}

Assistant:

ExprBase* CreateConditionCast(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeBool, value, EXPR_CAST_REINTERPRET);

	if(!ctx.IsIntegerType(value->type) && !value->type->isGeneric)
	{
		// TODO: function overload

		if(ctx.IsFloatingPointType(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeRef>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeUnsizedArray>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeFunction>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(value->type == ctx.typeAutoRef)
		{
			ExprBase *nullPtr = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(value->source, ctx.typeNullPtr);

			return CreateBinaryOp(ctx, source, SYN_BINARY_OP_NOT_EQUAL, value, nullPtr);
		}
		else
		{
			if(ExprBase *call = CreateFunctionCall1(ctx, source, InplaceStr("bool"), value, true, false, false))
				return call;

			return ReportExpected(ctx, source, ctx.typeBool, "ERROR: condition type cannot be '%.*s' and function for conversion to bool is undefined", FMT_ISTR(value->type->name));
		}
	}

	AssertValueExpression(ctx, source, value);

	if(value->type == ctx.typeLong)
		value = CreateCast(ctx, source, value, ctx.typeBool, false);

	return value;
}